

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg.h
# Opt level: O0

bool __thiscall TCLAP::Arg::argMatches(Arg *this,string *argFlag)

{
  bool bVar1;
  bool bVar2;
  __type _Var3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  __type local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_a8 [32];
  string local_88 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [56];
  
  __lhs = &local_58;
  flagStartString_abi_cxx11_();
  bVar2 = false;
  bVar1 = false;
  std::operator+(__lhs,in_RDI);
  _Var3 = std::operator==(in_RDI,in_RSI);
  if (_Var3) {
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
                            in_stack_ffffffffffffff18);
    local_c9 = true;
    if (bVar4) goto LAB_0014c714;
  }
  nameStartString_abi_cxx11_();
  bVar2 = true;
  std::operator+(__lhs,in_RDI);
  bVar1 = true;
  local_c9 = std::operator==(in_RDI,in_RSI);
LAB_0014c714:
  if (bVar1) {
    std::__cxx11::string::~string(local_88);
  }
  if (bVar2) {
    std::__cxx11::string::~string(local_a8);
  }
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return (local_c9 & 1U) != 0;
}

Assistant:

inline bool Arg::argMatches( const std::string& argFlag ) const
{
	if ( ( argFlag == Arg::flagStartString() + _flag && _flag != "" ) ||
	       argFlag == Arg::nameStartString() + _name )
		return true;
	else
		return false;
}